

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  float fVar5;
  float fVar6;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)table->ColumnsCount;
  if (table->ColumnsCount < 1) {
    uVar2 = uVar3;
  }
  fVar5 = 0.0;
  fVar6 = 0.0;
  for (; uVar2 * 0x68 - uVar3 != 0; uVar3 = uVar3 + 0x68) {
    pIVar1 = (table->Columns).Data;
    if (((&pIVar1->IsEnabled)[uVar3] == true) &&
       ((*(byte *)((long)&pIVar1->Flags + uVar3) & 8) != 0)) {
      fVar6 = fVar6 + *(float *)((long)&pIVar1->StretchWeight + uVar3);
      fVar5 = fVar5 + *(float *)((long)&pIVar1->WidthRequest + uVar3);
    }
  }
  for (lVar4 = 0; uVar2 * 0x68 - lVar4 != 0; lVar4 = lVar4 + 0x68) {
    pIVar1 = (table->Columns).Data;
    if (((&pIVar1->IsEnabled)[lVar4] == true) &&
       ((*(byte *)((long)&pIVar1->Flags + lVar4) & 8) != 0)) {
      *(float *)((long)&pIVar1->StretchWeight + lVar4) =
           (*(float *)((long)&pIVar1->WidthRequest + lVar4) / fVar5) * fVar6;
    }
  }
  return;
}

Assistant:

void ImGui::TableUpdateColumnsWeightFromWidth(ImGuiTable* table)
{
    IM_ASSERT(table->LeftMostStretchedColumn != -1 && table->RightMostStretchedColumn != -1);

    // Measure existing quantity
    float visible_weight = 0.0f;
    float visible_width = 0.0f;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        IM_ASSERT(column->StretchWeight > 0.0f);
        visible_weight += column->StretchWeight;
        visible_width += column->WidthRequest;
    }
    IM_ASSERT(visible_weight > 0.0f && visible_width > 0.0f);

    // Apply new weights
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (!column->IsEnabled || !(column->Flags & ImGuiTableColumnFlags_WidthStretch))
            continue;
        column->StretchWeight = (column->WidthRequest / visible_width) * visible_weight;
        IM_ASSERT(column->StretchWeight > 0.0f);
    }
}